

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::InferredValueFunction::checkArguments
          (InferredValueFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  Type *pTVar2;
  bitmask<slang::ast::ASTFlags> *this_01;
  SourceLocation in_RCX;
  Args *in_RDX;
  long in_RSI;
  ASTContext *in_RDI;
  SourceLocation in_R8;
  size_t in_stack_00000010;
  size_t in_stack_00000018;
  Compilation *comp;
  string *arg;
  Diagnostic *this_02;
  bitmask<slang::ast::ASTFlags> *in_stack_ffffffffffffff78;
  bitmask<slang::ast::ASTFlags> local_58 [2];
  SyntaxKind typeKind;
  ASTContext *context_00;
  SourceLocation SVar3;
  SourceLocation in_stack_fffffffffffffff8;
  
  context_00 = in_RDI;
  this_00 = ASTContext::getCompilation((ASTContext *)0x1364e7f);
  arg = (string *)0x0;
  this_02 = (Diagnostic *)0x0;
  callRange.endLoc = in_stack_fffffffffffffff8;
  callRange.startLoc = in_R8;
  SVar3 = in_R8;
  bVar1 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)in_RCX,context_00,SUB81((ulong)in_RSI >> 0x38,0),in_RDX,
                     callRange,in_stack_00000010,in_stack_00000018);
  typeKind = in_R8._4_4_;
  if (bVar1) {
    this_01 = (bitmask<slang::ast::ASTFlags> *)(in_RSI + 0x10);
    bitmask<slang::ast::ASTFlags>::bitmask(local_58,AssertionDefaultArg);
    bVar1 = bitmask<slang::ast::ASTFlags>::has(this_01,in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (((ulong)in_RDI[1].scope.ptr & 1) == 0) {
        pTVar2 = Compilation::getLogicType(this_00);
      }
      else {
        pTVar2 = Compilation::getType(this_00,typeKind);
      }
    }
    else {
      sourceRange.endLoc = SVar3;
      sourceRange.startLoc = in_RCX;
      ASTContext::addDiag(in_RDI,(DiagCode)0x1a000b,sourceRange);
      Diagnostic::operator<<(this_02,arg);
      pTVar2 = Compilation::getErrorType(this_00);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 0, 0))
            return comp.getErrorType();

        if (!context.flags.has(ASTFlags::AssertionDefaultArg)) {
            context.addDiag(diag::InferredValDefArg, range) << name;
            return comp.getErrorType();
        }

        return isClockFunc ? comp.getType(SyntaxKind::EventType) : comp.getLogicType();
    }